

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

void __thiscall Fl_Menu_Item_Type::write_static(Fl_Menu_Item_Type *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 extraout_var;
  bool bVar4;
  int local_f0;
  char *local_d0;
  char *local_c0;
  char *n_1;
  char *pcStack_98;
  int i_2;
  char *c;
  Fl_Menu_Item_Type *m;
  Fl_Type *q_2;
  int nextlevel;
  int thislevel;
  Fl_Type *q_1;
  Fl_Type *t;
  int i_1;
  int i;
  char *k;
  Fl_Type *q;
  Fl_Type *t_1;
  char *p;
  char *ut;
  char *k_1;
  char *cn;
  char *d;
  int local_18;
  int use_v;
  int use_o;
  int n;
  Fl_Menu_Item_Type *this_local;
  
  _use_o = this;
  pcVar2 = Fl_Type::callback((Fl_Type *)this);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = Fl_Type::callback((Fl_Type *)this);
    iVar1 = is_name(pcVar2);
    if (iVar1 != 0) {
      pcVar2 = Fl_Type::callback((Fl_Type *)this);
      iVar1 = Fl_Type::user_defined((Fl_Type *)this,pcVar2);
      if (iVar1 == 0) {
        pcVar2 = Fl_Type::callback((Fl_Type *)this);
        pcVar3 = Fl_Type::user_data_type((Fl_Type *)this);
        if (pcVar3 == (char *)0x0) {
          local_c0 = "void*";
        }
        else {
          local_c0 = Fl_Type::user_data_type((Fl_Type *)this);
        }
        write_declare("extern void %s(Fl_Menu_*, %s);",pcVar2,local_c0);
      }
    }
  }
  for (use_v = 0; use_v < 4; use_v = use_v + 1) {
    pcVar2 = Fl_Widget_Type::extra_code(&this->super_Fl_Widget_Type,use_v);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = Fl_Widget_Type::extra_code(&this->super_Fl_Widget_Type,use_v);
      iVar1 = isdeclare(pcVar2);
      if (iVar1 != 0) {
        pcVar2 = Fl_Widget_Type::extra_code(&this->super_Fl_Widget_Type,use_v);
        write_declare("%s",pcVar2);
      }
    }
  }
  pcVar2 = Fl_Type::callback((Fl_Type *)this);
  if (pcVar2 == (char *)0x0) goto LAB_00190498;
  pcVar2 = Fl_Type::callback((Fl_Type *)this);
  iVar1 = is_name(pcVar2);
  if (iVar1 != 0) goto LAB_00190498;
  local_18 = 0;
  d._4_4_ = 0;
  cn = Fl_Type::callback((Fl_Type *)this);
  while (*cn != '\0') {
    if ((*cn == 'o') && (iVar1 = is_id(cn[1]), iVar1 == 0)) {
      local_18 = 1;
    }
    if ((*cn == 'v') && (iVar1 = is_id(cn[1]), iVar1 == 0)) {
      d._4_4_ = 1;
    }
    do {
      cn = cn + 1;
      iVar1 = is_id(*cn);
    } while (iVar1 != 0);
    while( true ) {
      bVar4 = false;
      if (*cn != '\0') {
        iVar1 = is_id(*cn);
        bVar4 = iVar1 == 0;
      }
      if (!bVar4) break;
      cn = cn + 1;
    }
  }
  k_1 = Fl_Type::callback_name((Fl_Type *)this);
  ut = Fl_Type::class_name((Fl_Type *)this,1);
  if (ut == (char *)0x0) {
    write_c("\nstatic void %s(Fl_Menu_*",k_1);
  }
  else {
    write_c("\nvoid %s::%s_i(Fl_Menu_*",ut,k_1);
  }
  if (local_18 != 0) {
    write_c(" o");
  }
  pcVar2 = Fl_Type::user_data_type((Fl_Type *)this);
  if (pcVar2 == (char *)0x0) {
    local_d0 = "void*";
  }
  else {
    local_d0 = Fl_Type::user_data_type((Fl_Type *)this);
  }
  p = local_d0;
  write_c(", %s",local_d0);
  if (d._4_4_ != 0) {
    write_c(" v");
  }
  pcVar2 = Fl_Type::callback((Fl_Type *)this);
  write_c(") {\n  %s",pcVar2);
  if (cn[-1] != ';') {
    pcVar2 = Fl_Type::callback((Fl_Type *)this);
    t_1 = (Fl_Type *)strrchr(pcVar2,10);
    if (t_1 == (Fl_Type *)0x0) {
      t_1 = (Fl_Type *)Fl_Type::callback((Fl_Type *)this);
    }
    else {
      t_1 = (Fl_Type *)((long)&t_1->_vptr_Fl_Type + 1);
    }
    if ((*(char *)&t_1->_vptr_Fl_Type != '#') && (*(char *)&t_1->_vptr_Fl_Type != '\0')) {
      write_c(";");
    }
  }
  write_c("\n}\n");
  if (ut == (char *)0x0) goto LAB_00190498;
  write_c("void %s::%s(Fl_Menu_* o, %s v) {\n",ut,k_1,p);
  write_c("  ((%s*)(o",ut);
  q = (this->super_Fl_Widget_Type).super_Fl_Type.parent;
  while (iVar1 = (*q->_vptr_Fl_Type[0x1e])(), iVar1 != 0) {
    q = q->parent;
  }
  k = (char *)0x0;
  if (q != (Fl_Type *)0x0) {
    iVar1 = (*q->_vptr_Fl_Type[5])();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Fl_Input_Choice");
    if (iVar1 == 0) {
      write_c("->parent()");
    }
  }
  q = q->parent;
  while( true ) {
    bVar4 = false;
    if (q != (Fl_Type *)0x0) {
      iVar1 = (*q->_vptr_Fl_Type[0x17])();
      bVar4 = false;
      if (iVar1 != 0) {
        iVar1 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x26])();
        bVar4 = iVar1 == 0;
      }
    }
    if (!bVar4) break;
    write_c("->parent()");
    k = (char *)q;
    q = q->parent;
  }
  if (k == (char *)0x0) {
LAB_00190476:
    write_c("->user_data()");
  }
  else {
    pcVar2 = (char *)(**(code **)(*(long *)k + 0x28))();
    iVar1 = strcmp(pcVar2,"widget_class");
    if (iVar1 != 0) goto LAB_00190476;
  }
  write_c("))->%s_i(o,v);\n}\n",k_1);
LAB_00190498:
  if (((this->super_Fl_Widget_Type).image != (Fluid_Image *)0x0) &&
     (((this->super_Fl_Widget_Type).image)->written != write_number)) {
    Fluid_Image::write_static((this->super_Fl_Widget_Type).image);
    ((this->super_Fl_Widget_Type).image)->written = write_number;
  }
  if (((this->super_Fl_Widget_Type).super_Fl_Type.next == (Fl_Type *)0x0) ||
     (iVar1 = (*((this->super_Fl_Widget_Type).super_Fl_Type.next)->_vptr_Fl_Type[0x1e])(),
     iVar1 == 0)) {
    pcVar2 = Fl_Type::class_name((Fl_Type *)this,1);
    _i_1 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      if (i18n_type != 0) {
        pcVar2 = menu_name(this,(int *)&t);
        write_c("\nunsigned char %s_i18n_done = 0;",pcVar2);
      }
      pcVar2 = menu_name(this,(int *)&t);
      write_c("\nFl_Menu_Item %s[] = {\n",pcVar2);
    }
    else {
      if (i18n_type != 0) {
        pcVar3 = menu_name(this,(int *)((long)&t + 4));
        write_c("\nunsigned char %s::%s_i18n_done = 0;",pcVar2,pcVar3);
      }
      pcVar2 = _i_1;
      pcVar3 = menu_name(this,(int *)((long)&t + 4));
      write_c("\nFl_Menu_Item %s::%s[] = {\n",pcVar2,pcVar3);
    }
    q_1 = (this->super_Fl_Widget_Type).super_Fl_Type.prev;
    while( true ) {
      bVar4 = false;
      if (q_1 != (Fl_Type *)0x0) {
        iVar1 = (*q_1->_vptr_Fl_Type[0x1e])();
        bVar4 = iVar1 != 0;
      }
      if (!bVar4) break;
      q_1 = q_1->prev;
    }
    _nextlevel = q_1->next;
    while( true ) {
      bVar4 = false;
      if (_nextlevel != (Fl_Type *)0x0) {
        iVar1 = (*_nextlevel->_vptr_Fl_Type[0x1e])();
        bVar4 = iVar1 != 0;
      }
      if (!bVar4) break;
      write_item((Fl_Menu_Item_Type *)_nextlevel);
      q_2._4_4_ = (((Fl_Menu_Item_Type *)_nextlevel)->super_Fl_Widget_Type).super_Fl_Type.level;
      iVar1 = (*(((Fl_Menu_Item_Type *)_nextlevel)->super_Fl_Widget_Type).super_Fl_Type.
                _vptr_Fl_Type[0x16])();
      if (iVar1 != 0) {
        q_2._4_4_ = q_2._4_4_ + 1;
      }
      if (((((Fl_Menu_Item_Type *)_nextlevel)->super_Fl_Widget_Type).super_Fl_Type.next ==
           (Fl_Type *)0x0) ||
         (iVar1 = (*((((Fl_Menu_Item_Type *)_nextlevel)->super_Fl_Widget_Type).super_Fl_Type.next)->
                    _vptr_Fl_Type[0x1e])(), iVar1 == 0)) {
        local_f0 = q_1->level + 1;
      }
      else {
        local_f0 = ((((Fl_Menu_Item_Type *)_nextlevel)->super_Fl_Widget_Type).super_Fl_Type.next)->
                   level;
      }
      q_2._0_4_ = local_f0;
      for (; (int)q_2 < q_2._4_4_; q_2._4_4_ = q_2._4_4_ + -1) {
        write_c(" {0,0,0,0,0,0,0,0,0},\n");
      }
      _nextlevel = (((Fl_Menu_Item_Type *)_nextlevel)->super_Fl_Widget_Type).super_Fl_Type.next;
    }
    write_c(" {0,0,0,0,0,0,0,0,0}\n};\n");
    if (_i_1 != (char *)0x0) {
      q_1 = (this->super_Fl_Widget_Type).super_Fl_Type.prev;
      while( true ) {
        bVar4 = false;
        if (q_1 != (Fl_Type *)0x0) {
          iVar1 = (*q_1->_vptr_Fl_Type[0x1e])();
          bVar4 = iVar1 != 0;
        }
        if (!bVar4) break;
        q_1 = q_1->prev;
      }
      m = (Fl_Menu_Item_Type *)q_1->next;
      while( true ) {
        bVar4 = false;
        if (m != (Fl_Menu_Item_Type *)0x0) {
          iVar1 = (*(m->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])();
          bVar4 = iVar1 != 0;
        }
        if (!bVar4) break;
        c = (char *)m;
        pcVar2 = array_name(&m->super_Fl_Widget_Type);
        pcStack_98 = pcVar2;
        if (pcVar2 != (char *)0x0) {
          pcVar3 = Fl_Type::name((Fl_Type *)c);
          if (pcVar2 == pcVar3) {
            pcVar2 = menu_name(m,(int *)((long)&n_1 + 4));
            write_c("Fl_Menu_Item* %s::%s = %s::%s + %d;\n",_i_1,pcStack_98,_i_1,pcVar2,
                    (ulong)n_1._4_4_);
          }
          else {
            write_c("Fl_Menu_Item* %s::%s;\n",_i_1,pcStack_98);
          }
        }
        m = (Fl_Menu_Item_Type *)(m->super_Fl_Widget_Type).super_Fl_Type.next;
      }
    }
  }
  return;
}

Assistant:

void Fl_Menu_Item_Type::write_static() {
  if (callback() && is_name(callback()) && !user_defined(callback()))
    write_declare("extern void %s(Fl_Menu_*, %s);", callback(),
                  user_data_type() ? user_data_type() : "void*");
  for (int n=0; n < NUM_EXTRA_CODE; n++) {
    if (extra_code(n) && isdeclare(extra_code(n)))
      write_declare("%s", extra_code(n));
  }
  if (callback() && !is_name(callback())) {
    // see if 'o' or 'v' used, to prevent unused argument warnings:
    int use_o = 0;
    int use_v = 0;
    const char *d;
    for (d = callback(); *d;) {
      if (*d == 'o' && !is_id(d[1])) use_o = 1;
      if (*d == 'v' && !is_id(d[1])) use_v = 1;
      do d++; while (is_id(*d));
      while (*d && !is_id(*d)) d++;
    }
    const char* cn = callback_name();
    const char* k = class_name(1);
    if (k) {
      write_c("\nvoid %s::%s_i(Fl_Menu_*", k, cn);
    } else {
      write_c("\nstatic void %s(Fl_Menu_*", cn);
    }
    if (use_o) write_c(" o");
    const char* ut = user_data_type() ? user_data_type() : "void*";
    write_c(", %s", ut);
    if (use_v) write_c(" v");
    write_c(") {\n  %s", callback());
    if (*(d-1) != ';') {
      const char *p = strrchr(callback(), '\n');
      if (p) p ++;
      else p = callback();
      // Only add trailing semicolon if the last line is not a preprocessor
      // statement...
      if (*p != '#' && *p) write_c(";");
    }
    write_c("\n}\n");
    if (k) {
      write_c("void %s::%s(Fl_Menu_* o, %s v) {\n", k, cn, ut);
      write_c("  ((%s*)(o", k);
      Fl_Type* t = parent; while (t->is_menu_item()) t = t->parent;
      Fl_Type *q = 0;
      // Go up one more level for Fl_Input_Choice, as these are groups themselves
      if (t && !strcmp(t->type_name(), "Fl_Input_Choice"))
        write_c("->parent()");
      for (t = t->parent; t && t->is_widget() && !is_class(); q = t, t = t->parent) 
        write_c("->parent()");
      if (!q || strcmp(q->type_name(), "widget_class"))
        write_c("->user_data()");
      write_c("))->%s_i(o,v);\n}\n", cn);
    }
  }
  if (image) {
    if (image->written != write_number) {
      image->write_static();
      image->written = write_number;
    }
  }
  if (next && next->is_menu_item()) return;
  // okay, when we hit last item in the menu we have to write the
  // entire array out:
  const char* k = class_name(1);
  if (k) {
    int i; 
    if (i18n_type) write_c("\nunsigned char %s::%s_i18n_done = 0;", k, menu_name(i));
    write_c("\nFl_Menu_Item %s::%s[] = {\n", k, menu_name(i));
  } else {
    int i; 
    if (i18n_type) write_c("\nunsigned char %s_i18n_done = 0;", menu_name(i));
    write_c("\nFl_Menu_Item %s[] = {\n", menu_name(i));
  }
  Fl_Type* t = prev; while (t && t->is_menu_item()) t = t->prev;
  for (Fl_Type* q = t->next; q && q->is_menu_item(); q = q->next) {
    ((Fl_Menu_Item_Type*)q)->write_item();
    int thislevel = q->level; if (q->is_parent()) thislevel++;
    int nextlevel =
      (q->next && q->next->is_menu_item()) ? q->next->level : t->level+1;
    while (thislevel > nextlevel) {write_c(" {0,0,0,0,0,0,0,0,0},\n"); thislevel--;}
  }
  write_c(" {0,0,0,0,0,0,0,0,0}\n};\n");

  if (k) {
    // Write menu item variables...
    t = prev; while (t && t->is_menu_item()) t = t->prev;
    for (Fl_Type* q = t->next; q && q->is_menu_item(); q = q->next) {
      Fl_Menu_Item_Type *m = (Fl_Menu_Item_Type*)q;
      const char *c = array_name(m);
      if (c) {
        if (c==m->name()) {
          // assign a menu item address directly to a variable
          int i; 
          const char* n = ((Fl_Menu_Item_Type *)q)->menu_name(i);
          write_c("Fl_Menu_Item* %s::%s = %s::%s + %d;\n", k, c, k, n, i);
        } else {
          // if the name is an array, only define the array. 
          // The actual assignment is in write_code1()
          write_c("Fl_Menu_Item* %s::%s;\n", k, c);
        }
      }
    }
  }
}